

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_convolve_scale_test.cc
# Opt level: O1

void __thiscall
anon_unknown.dwarf_29d038f::ConvolveScaleTestBase<unsigned_char>::Prep
          (ConvolveScaleTestBase<unsigned_char> *this,ACMRandom *rnd)

{
  TestImage<unsigned_char> *pTVar1;
  int iVar2;
  
  iVar2 = RandomSubpel(rnd);
  this->subpel_x_ = iVar2;
  iVar2 = RandomSubpel(rnd);
  this->subpel_y_ = iVar2;
  pTVar1 = this->image_;
  PrepBuffers<unsigned_char>
            (rnd,pTVar1->w_,pTVar1->h_,pTVar1->src_stride_,pTVar1->bd_,false,
             (pTVar1->src_data_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
             _M_impl.super__Vector_impl_data._M_start);
  PrepBuffers<unsigned_char>
            (rnd,pTVar1->w_,pTVar1->h_,pTVar1->dst_stride_,pTVar1->bd_,true,
             (pTVar1->dst_data_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
             _M_impl.super__Vector_impl_data._M_start);
  PrepBuffers<unsigned_short>
            (rnd,pTVar1->w_,pTVar1->h_,pTVar1->dst_stride_,pTVar1->bd_,true,
             (pTVar1->dst_16_data_).
             super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
             super__Vector_impl_data._M_start);
  return;
}

Assistant:

void Prep(ACMRandom *rnd) {
    assert(rnd);

    // Choose subpel_x_ and subpel_y_. They should be less than
    // SCALE_SUBPEL_SHIFTS; we also want to add extra weight to
    // "interesting" values: 0 and SCALE_SUBPEL_SHIFTS - 1
    subpel_x_ = RandomSubpel(rnd);
    subpel_y_ = RandomSubpel(rnd);

    image_->Initialize(rnd);
  }